

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_DeadWallDraw_Test::TEST_WiningStateTest_DeadWallDraw_Test
          (TEST_WiningStateTest_DeadWallDraw_Test *this)

{
  TEST_WiningStateTest_DeadWallDraw_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupWiningStateTest::TEST_GROUP_CppUTestGroupWiningStateTest
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest);
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_WiningStateTest_DeadWallDraw_Test_0025b408;
  return;
}

Assistant:

TEST(WiningStateTest, DeadWallDraw)
{
	addNoWiningHand(true);

	SelfDrawnSituation situation;
	situation.is_dead_wall = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DeadWallDraw));
	CHECK_EQUAL(1, r.doubling_factor);
}